

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

string * __thiscall
spvtools::val::Instruction::GetOperandAs<std::__cxx11::string>
          (string *__return_storage_ptr__,Instruction *this,size_t index)

{
  const_reference pvVar1;
  utils *this_00;
  undefined1 in_R8B;
  
  pvVar1 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::at
                     (&this->operands_,index);
  if ((uint)pvVar1->num_words + (uint)pvVar1->offset <= (uint)(this->inst_).num_words) {
    this_00 = (utils *)((this->words_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start + pvVar1->offset);
    utils::MakeString<unsigned_int_const*>
              (__return_storage_ptr__,this_00,(uint *)(this_00 + (ulong)pvVar1->num_words * 4),
               (uint *)0x1,(bool)in_R8B);
    return __return_storage_ptr__;
  }
  __assert_fail("o.offset + o.num_words <= inst_.num_words",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/instruction.cpp"
                ,0x32,"std::string spvtools::val::Instruction::GetOperandAs(size_t) const");
}

Assistant:

std::string Instruction::GetOperandAs<std::string>(size_t index) const {
  const spv_parsed_operand_t& o = operands_.at(index);
  assert(o.offset + o.num_words <= inst_.num_words);
  return spvtools::utils::MakeString(words_.data() + o.offset, o.num_words);
}